

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O1

bool __thiscall
draco::
DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id)

{
  pointer *ppIVar1;
  ulong *puVar2;
  iterator iVar3;
  pointer pIVar4;
  _Bit_type *p_Var5;
  MeshAttributeIndicesEncodingData *pMVar6;
  CornerTable *pCVar7;
  ulong uVar8;
  uint uVar9;
  pointer pIVar10;
  uint uVar11;
  ulong uVar12;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar13;
  uint uVar14;
  int iVar15;
  difference_type __n;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  if ((corner_id.value_ != 0xffffffff) &&
     ((*(ulong *)((long)(this->
                        super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 (ulong)(corner_id.value_ / 0x18 & 0xfffffff8)) >>
       ((ulong)corner_id.value_ / 3 & 0x3f) & 1) == 0)) {
    pIVar10 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar10) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
    }
    iVar3._M_current =
         (this->corner_traversal_stack_).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_3c.value_ = corner_id.value_;
    if (iVar3._M_current ==
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)&this->corner_traversal_stack_,iVar3,&local_3c);
    }
    else {
      (iVar3._M_current)->value_ = corner_id.value_;
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    IVar13.value_ = local_3c.value_;
    if (local_3c.value_ != 0xffffffff) {
      IVar13.value_ = local_3c.value_ - 2;
      if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
        IVar13.value_ = local_3c.value_ + 1;
      }
    }
    pIVar4 = (((this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).corner_table_)->corner_to_vertex_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = pIVar4[IVar13.value_].value_;
    IVar13.value_ = local_3c.value_;
    if (local_3c.value_ != 0xffffffff) {
      IVar13.value_ = ((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_3c.value_;
    }
    if (uVar11 == 0xffffffff) {
      return false;
    }
    uVar14 = pIVar4[IVar13.value_].value_;
    if (uVar14 == 0xffffffff) {
      return false;
    }
    p_Var5 = (this->
             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar16 = p_Var5[uVar11 >> 6];
    if ((uVar16 >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
      p_Var5[uVar11 >> 6] = uVar16 | 1L << ((byte)uVar11 & 0x3f);
      local_40.value_ = local_3c.value_;
      if (local_3c.value_ != 0xffffffff) {
        local_40.value_ = local_3c.value_ - 2;
        if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
          local_40.value_ = local_3c.value_ + 1;
        }
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_40.value_ / 3]._M_elems
                 [local_40.value_ % 3].value_);
      pMVar6 = (this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar3._M_current =
           (pMVar6->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pMVar6->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar6,iVar3,&local_40);
      }
      else {
        (iVar3._M_current)->value_ = local_40.value_;
        (pMVar6->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pMVar6 = (this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar6->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar11]
           = pMVar6->num_values;
      pMVar6->num_values = pMVar6->num_values + 1;
    }
    p_Var5 = (this->
             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar16 = p_Var5[uVar14 >> 6];
    if ((uVar16 >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
      p_Var5[uVar14 >> 6] = uVar16 | 1L << ((byte)uVar14 & 0x3f);
      local_40.value_ = local_3c.value_;
      if (local_3c.value_ != 0xffffffff) {
        local_40.value_ = ((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_3c.value_;
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_40.value_ / 3]._M_elems
                 [local_40.value_ % 3].value_);
      pMVar6 = (this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar3._M_current =
           (pMVar6->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pMVar6->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar6,iVar3,&local_40);
      }
      else {
        (iVar3._M_current)->value_ = local_40.value_;
        (pMVar6->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pMVar6 = (this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar6->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar14]
           = pMVar6->num_values;
      pMVar6->num_values = pMVar6->num_values + 1;
    }
    pIVar10 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->corner_traversal_stack_;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar10) {
      do {
        local_3c.value_ = pIVar10[-1].value_;
        if ((local_3c.value_ == 0xffffffff) ||
           (uVar16 = (ulong)local_3c.value_ / 3,
           (*(ulong *)((long)(this->
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (ulong)(local_3c.value_ / 0x18 & 0xfffffff8)) >> (uVar16 & 0x3f) & 1) != 0)) {
          (this->corner_traversal_stack_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar10 + -1;
          iVar15 = 0;
        }
        else {
          do {
            puVar2 = (this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar16 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar16 & 0x3f);
            pCVar7 = (this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).corner_table_;
            uVar11 = (pCVar7->corner_to_vertex_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_3c.value_].value_;
            uVar12 = (ulong)uVar11;
            if (uVar12 == 0xffffffff) {
              iVar15 = 1;
            }
            else {
              p_Var5 = (this->
                       super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                       ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar8 = p_Var5[uVar11 >> 6];
              uVar17 = uVar16;
              if ((uVar8 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar14 = (pCVar7->vertex_to_left_most_corner_map_).
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
                bVar18 = true;
                if (uVar14 != 0xffffffff) {
                  uVar9 = uVar14 - 2;
                  if (0x55555555 < (uVar14 + 1) * -0x55555555) {
                    uVar9 = uVar14 + 1;
                  }
                  uVar14 = 0xffffffff;
                  if ((uVar9 != 0xffffffff) &&
                     ((*(ulong *)((long)(pCVar7->is_edge_on_seam_).
                                        super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p + (ulong)(uVar9 >> 6) * 8) >> ((ulong)uVar9 & 0x3f) & 1
                      ) == 0)) {
                    uVar14 = (pCVar7->corner_table_->opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar9].value_;
                  }
                  if (uVar14 != 0xffffffff) {
                    iVar15 = uVar14 - 2;
                    if (0x55555555 < (uVar14 + 1) * -0x55555555) {
                      iVar15 = uVar14 + 1;
                    }
                    bVar18 = iVar15 == -1;
                  }
                }
                p_Var5[uVar11 >> 6] = uVar8 | 1L << ((byte)uVar11 & 0x3f);
                local_40.value_ = local_3c.value_;
                PointsSequencer::AddPointId
                          ((this->
                           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                           ).traversal_observer_.sequencer_,
                           (PointIndex)
                           (((this->
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             ).traversal_observer_.mesh_)->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(ulong)local_3c.value_ / 3].
                           _M_elems[local_3c.value_ % 3].value_);
                pMVar6 = (this->
                         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                         ).traversal_observer_.encoding_data_;
                iVar3._M_current =
                     (pMVar6->encoded_attribute_value_index_to_corner_map).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pMVar6->encoded_attribute_value_index_to_corner_map).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                              *)pMVar6,iVar3,&local_40);
                }
                else {
                  (iVar3._M_current)->value_ = local_40.value_;
                  (pMVar6->encoded_attribute_value_index_to_corner_map).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                pMVar6 = (this->
                         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                         ).traversal_observer_.encoding_data_;
                (pMVar6->vertex_to_encoded_attribute_value_index_map).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar12] = pMVar6->num_values;
                pMVar6->num_values = pMVar6->num_values + 1;
                iVar15 = 0;
                if (!bVar18) {
                  uVar16 = (ulong)local_3c.value_;
                  if (local_3c.value_ != 0xffffffff) {
                    uVar16 = (ulong)(local_3c.value_ - 2);
                    if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
                      uVar16 = (ulong)(local_3c.value_ + 1);
                    }
                  }
                  local_3c.value_ = 0xffffffff;
                  if (((int)uVar16 != -1) &&
                     (pCVar7 = (this->
                               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                               ).corner_table_,
                     (*(ulong *)((long)(pCVar7->is_edge_on_seam_).
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) == 0)) {
                    local_3c.value_ =
                         (pCVar7->corner_table_->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].value_;
                  }
                  uVar16 = (ulong)local_3c.value_ / 3;
                  iVar15 = 4;
                }
                uVar17 = uVar16;
                if (!bVar18) goto LAB_00136e9e;
              }
              uVar12 = (ulong)local_3c.value_;
              uVar16 = uVar12;
              if (local_3c.value_ != 0xffffffff) {
                uVar16 = (ulong)(local_3c.value_ - 2);
                if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
                  uVar16 = (ulong)(local_3c.value_ + 1);
                }
              }
              pCVar7 = (this->
                       super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                       ).corner_table_;
              local_40.value_ = 0xffffffff;
              if (((int)uVar16 != -1) &&
                 ((*(ulong *)((long)(pCVar7->is_edge_on_seam_).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) == 0)) {
                local_40.value_ =
                     (pCVar7->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].value_;
              }
              if (local_3c.value_ != 0xffffffff) {
                uVar12 = (ulong)(((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) +
                                local_3c.value_);
              }
              uVar11 = 0xffffffff;
              if (((int)uVar12 != -1) &&
                 ((*(ulong *)((long)(pCVar7->is_edge_on_seam_).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) == 0)) {
                uVar11 = (pCVar7->corner_table_->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
              }
              uVar16 = (ulong)local_40.value_ / 3;
              uVar12 = (ulong)uVar11 / 3;
              if (uVar11 == 0xffffffff) {
                uVar12 = 0xffffffff;
              }
              if ((local_40.value_ == 0xffffffff) ||
                 (((this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16 >> 6] >>
                   (uVar16 & 0x3f) & 1) != 0)) {
                if ((uVar11 == 0xffffffff) ||
                   (((this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >>
                     (uVar12 & 0x3f) & 1) != 0)) {
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  goto LAB_00136e65;
                }
                iVar15 = 0;
                uVar16 = uVar12;
                local_3c.value_ = uVar11;
              }
              else if ((uVar11 == 0xffffffff) ||
                      (((this->
                        super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6]
                        >> (uVar12 & 0x3f) & 1) != 0)) {
                iVar15 = 0;
                local_3c.value_ = local_40.value_;
              }
              else {
                iVar3._M_current =
                     (this->corner_traversal_stack_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                iVar3._M_current[-1].value_ = uVar11;
                if (iVar3._M_current ==
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (local_38,iVar3,&local_40);
                }
                else {
                  (iVar3._M_current)->value_ = local_40.value_;
                  (this->corner_traversal_stack_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
LAB_00136e65:
                iVar15 = 5;
                uVar16 = uVar17;
              }
            }
LAB_00136e9e:
          } while ((iVar15 == 0) || (iVar15 == 4));
          if (iVar15 == 5) {
            iVar15 = 0;
          }
        }
        if (iVar15 != 0) {
          return false;
        }
        pIVar10 = (this->corner_traversal_stack_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while ((this->corner_traversal_stack_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != pIVar10);
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }